

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O0

prsndef * prslst(prscxdef *ctx)

{
  prsndef *in_RDI;
  tokdef t;
  prsndef *node;
  prsndef *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff8c;
  undefined2 in_stack_ffffffffffffff90;
  undefined6 in_stack_ffffffffffffff92;
  prsndef *local_10;
  
  local_10 = (prsndef *)0x0;
  while (*(int *)((long)&(in_RDI->prsnv).prsnvn[0][2].prsnv + 0x28) != 0x3b) {
    in_stack_ffffffffffffff78 = in_RDI;
    prsxexp((prscxdef *)CONCAT62(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90),
            in_stack_ffffffffffffff8c);
    local_10 = prsnew2((prscxdef *)CONCAT62(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff8c,
                       (prsndef *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       in_stack_ffffffffffffff78);
    if (*(int *)((long)&(in_RDI->prsnv).prsnvn[0][2].prsnv + 0x28) == 0x3f) {
      toknext((tokcxdef *)t.toknam._24_8_);
    }
  }
  toknext((tokcxdef *)t.toknam._24_8_);
  if (local_10 == (prsndef *)0x0) {
    local_10 = prsnew0((prscxdef *)CONCAT44(in_stack_ffffffffffffff84,0x4c),
                       (tokdef *)in_stack_ffffffffffffff78);
  }
  return local_10;
}

Assistant:

static prsndef *prslst(prscxdef *ctx)
{
    prsndef *node = (prsndef *)0;
    
    for (;;)
    {
        if (ctx->prscxtok->tokcxcur.toktyp == TOKTRBRACK) break;
        node = prsnew2(ctx, TOKTRBRACK, prsxexp(ctx, TRUE), node);
        
        /* allow optional comma (just skip it if one is present) */
        if (ctx->prscxtok->tokcxcur.toktyp == TOKTCOMMA)
            toknext(ctx->prscxtok);
    }
    toknext(ctx->prscxtok);                       /* skip the right bracket */
    
    /* if it's an empty list, make an empty list token for it */
    if (!node)
    {
        tokdef t;
        
        t.toktyp = TOKTLIST;
        t.tokofs = 0;
        node = prsnew0(ctx, &t);
    }
    
    return(node);
}